

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

size_t ValueType::GetLowestBitIndex(Bits b)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  undefined4 *puVar5;
  uint uVar6;
  undefined6 in_register_0000003a;
  
  uVar6 = (uint)CONCAT62(in_register_0000003a,b);
  if (uVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x5a7,"(b)","b");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    sVar4 = 0;
  }
  else {
    uVar1 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    sVar4 = (size_t)uVar1;
  }
  return sVar4;
}

Assistant:

size_t ValueType::GetLowestBitIndex(const Bits b)
{
    Assert(b);

    DWORD i;
    ::GetFirstBitSet(&i, static_cast<UnitWord32>(b));
    return i;
}